

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

bool __thiscall helics::CommsInterface::reconnect(CommsInterface *this)

{
  int iVar1;
  bool bVar2;
  string_view message;
  string_view message_00;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  
  LOCK();
  (this->rxStatus)._M_i = RECONNECTING;
  UNLOCK();
  LOCK();
  (this->txStatus)._M_i = RECONNECTING;
  UNLOCK();
  (*this->_vptr_CommsInterface[9])();
  (*this->_vptr_CommsInterface[8])(this);
  iVar1 = 400;
  do {
    if ((this->rxStatus)._M_i != RECONNECTING) goto LAB_0027e00b;
    local_20.__r = 0x32;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  message._M_str = "unable to reconnect";
  message._M_len = 0x13;
  logError(this,message);
LAB_0027e00b:
  iVar1 = 400;
  do {
    if ((this->txStatus)._M_i != RECONNECTING) goto LAB_0027e047;
    local_20.__r = 0x32;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  message_00._M_str = "unable to reconnect";
  message_00._M_len = 0x13;
  logError(this,message_00);
LAB_0027e047:
  if ((this->rxStatus)._M_i == CONNECTED) {
    bVar2 = (this->txStatus)._M_i == CONNECTED;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CommsInterface::reconnect()
{
    rxStatus = ConnectionStatus::RECONNECTING;
    txStatus = ConnectionStatus::RECONNECTING;
    reconnectReceiver();
    reconnectTransmitter();
    int cnt = 0;
    while (rxStatus.load() == ConnectionStatus::RECONNECTING) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        ++cnt;
        if (cnt == 400)  // Eventually give up
        {
            logError("unable to reconnect");
            break;
        }
    }
    cnt = 0;
    while (txStatus.load() == ConnectionStatus::RECONNECTING) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        ++cnt;
        if (cnt == 400) {
            logError("unable to reconnect");
            break;
        }
    }

    return ((rxStatus.load() == ConnectionStatus::CONNECTED) &&
            (txStatus.load() == ConnectionStatus::CONNECTED));
}